

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  sqlite3 *db;
  ExprList_item *pEVar4;
  ExprList *pEVar5;
  ulong n;
  
  db = pParse->db;
  if (pList == (ExprList *)0x0) {
    pEVar5 = (ExprList *)sqlite3DbMallocRawNN(db,0x28);
    if (pEVar5 == (ExprList *)0x0) {
      pList = (ExprList *)0x0;
LAB_001750c3:
      if (pExpr != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,pExpr);
      }
      if (pList != (ExprList *)0x0) {
        exprListDeleteNN(db,pList);
      }
      return (ExprList *)0x0;
    }
    pEVar5->nExpr = 0;
  }
  else {
    uVar2 = pList->nExpr;
    pEVar5 = pList;
    if ((uVar2 & uVar2 - 1) == 0) {
      n = (long)(int)uVar2 << 6 | 8;
      if (((pList < (ExprList *)(db->lookaside).pStart) ||
          ((ExprList *)(db->lookaside).pEnd <= pList)) || ((db->lookaside).sz < n)) {
        pEVar5 = (ExprList *)dbReallocFinish(db,pList,n);
      }
      if (pEVar5 == (ExprList *)0x0) goto LAB_001750c3;
    }
  }
  iVar3 = pEVar5->nExpr;
  pEVar5->nExpr = iVar3 + 1;
  ppcVar1 = &pEVar5->a[iVar3].zName;
  *ppcVar1 = (char *)0x0;
  ppcVar1[1] = (char *)0x0;
  pEVar4 = pEVar5->a + iVar3;
  pEVar4->sortOrder = '\0';
  *(undefined3 *)&pEVar4->field_0x19 = 0;
  pEVar4->u = (anon_union_4_2_6146edf4_for_u)0x0;
  pEVar5->a[iVar3].pExpr = pExpr;
  return pEVar5;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(db, sizeof(ExprList) );
    if( pList==0 ){
      goto no_mem;
    }
    pList->nExpr = 0;
  }else if( (pList->nExpr & (pList->nExpr-1))==0 ){
    ExprList *pNew;
    pNew = sqlite3DbRealloc(db, pList, 
         sizeof(*pList)+(2*(sqlite3_int64)pList->nExpr-1)*sizeof(pList->a[0]));
    if( pNew==0 ){
      goto no_mem;
    }
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  assert( offsetof(struct ExprList_item,zName)==sizeof(pItem->pExpr) );
  assert( offsetof(struct ExprList_item,pExpr)==0 );
  memset(&pItem->zName,0,sizeof(*pItem)-offsetof(struct ExprList_item,zName));
  pItem->pExpr = pExpr;
  return pList;

no_mem:     
  /* Avoid leaking memory if malloc has failed. */
  sqlite3ExprDelete(db, pExpr);
  sqlite3ExprListDelete(db, pList);
  return 0;
}